

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
          (ConfidentialTxOutReference *this,ConfidentialTxOut *tx_out)

{
  ConfidentialTxOut *tx_out_local;
  ConfidentialTxOutReference *this_local;
  
  AbstractTxOutReference::AbstractTxOutReference
            (&this->super_AbstractTxOutReference,&tx_out->super_AbstractTxOut);
  (this->super_AbstractTxOutReference)._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialTxOutReference_00892100;
  ConfidentialTxOut::GetAsset(&this->asset_,tx_out);
  ConfidentialTxOut::GetConfidentialValue(&this->confidential_value_,tx_out);
  ConfidentialTxOut::GetNonce(&this->nonce_,tx_out);
  ConfidentialTxOut::GetSurjectionProof(&this->surjection_proof_,tx_out);
  ConfidentialTxOut::GetRangeProof(&this->range_proof_,tx_out);
  return;
}

Assistant:

ConfidentialTxOutReference::ConfidentialTxOutReference(
    const ConfidentialTxOut &tx_out)
    : AbstractTxOutReference(tx_out),
      asset_(tx_out.GetAsset()),
      confidential_value_(tx_out.GetConfidentialValue()),
      nonce_(tx_out.GetNonce()),
      surjection_proof_(tx_out.GetSurjectionProof()),
      range_proof_(tx_out.GetRangeProof()) {
  // do nothing
}